

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::Internal::
     Evaluator<bsim::quad_value_bit_vector,_bsim::quad_value_bit_vector,_(Catch::Internal::Operator)2>
     ::evaluate(quad_value_bit_vector *lhs,quad_value_bit_vector *rhs)

{
  uchar uVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  pointer pqVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  iVar3 = lhs->N;
  uVar7 = (ulong)iVar3;
  bVar11 = (long)uVar7 < 1;
  if (0 < (long)uVar7) {
    pqVar5 = (lhs->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (1 < pqVar5->value) {
      return false;
    }
    uVar8 = 0;
    do {
      uVar9 = uVar7;
      if (uVar7 - 1 == uVar8) break;
      uVar9 = uVar8 + 1;
      lVar6 = uVar8 + 1;
      uVar8 = uVar9;
    } while (pqVar5[lVar6].value < 2);
    bVar11 = uVar7 <= uVar9;
  }
  if (bVar11) {
    iVar4 = rhs->N;
    uVar8 = (ulong)iVar4;
    bVar11 = (long)uVar8 < 1;
    if (0 < (long)uVar8) {
      pqVar5 = (rhs->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (1 < pqVar5->value) {
        return false;
      }
      uVar9 = 0;
      do {
        uVar10 = uVar8;
        if (uVar8 - 1 == uVar9) break;
        uVar10 = uVar9 + 1;
        lVar6 = uVar9 + 1;
        uVar9 = uVar10;
      } while (pqVar5[lVar6].value < 2);
      bVar11 = uVar8 <= uVar10;
    }
    if (bVar11) {
      if (iVar4 == iVar3 && iVar3 >= 1) {
        bVar11 = false;
        uVar8 = 1;
        do {
          uVar1 = (lhs->bits).
                  super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8 - 1].value;
          if (uVar1 == '\x03') {
            __assert_fail("!a.is_high_impedance()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                          ,0x109,"bool bsim::operator!=(const quad_value &, const quad_value &)");
          }
          uVar2 = (rhs->bits).
                  super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8 - 1].value;
          if (uVar2 == '\x03') {
            __assert_fail("!b.is_high_impedance()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                          ,0x10a,"bool bsim::operator!=(const quad_value &, const quad_value &)");
          }
          if ((uVar1 == '\x02') || (uVar1 != uVar2)) break;
          bVar11 = uVar7 <= uVar8;
          bVar12 = uVar8 != uVar7;
          uVar8 = uVar8 + 1;
        } while (bVar12);
      }
      else {
        bVar11 = iVar3 < 1 && iVar4 == iVar3;
      }
      if (!bVar11) {
        bVar11 = bsim::operator>(lhs,rhs);
        return !bVar11;
      }
    }
  }
  return false;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs ) {
            return opCast( lhs ) < opCast( rhs );
        }